

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

bool __thiscall QFormLayout::isRowVisible(QFormLayout *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QFormLayoutPrivate *this_00;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *d;
  ItemRole role;
  int row;
  ItemRole *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  QWidget *in_stack_ffffffffffffffd0;
  QLayoutPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFormLayout *)0x4b8c3f);
  bVar2 = QLayoutPrivate::checkWidget(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    getWidgetPosition((QFormLayout *)this_00,in_RDI,
                      (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffffa4,
               (char *)in_stack_ffffffffffffff98);
    QMessageLogger::warning(&stack0xffffffffffffffd0,"QFormLayout::takeRow: Invalid widget");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QFormLayout::isRowVisible(QWidget *widget) const
{
    Q_D(const QFormLayout);
    if (Q_UNLIKELY(!d->checkWidget(widget)))
        return false;
    int row;
    ItemRole role;
    getWidgetPosition(widget, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::takeRow: Invalid widget");
        return false;
    }

    return isRowVisible(row);
}